

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibNetworkException.hh
# Opt level: O2

void __thiscall mognetwork::LibNetworkException::~LibNetworkException(LibNetworkException *this)

{
  ~LibNetworkException(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~LibNetworkException() throw() {}